

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

base_learner * CSOAA::csoaa_setup(options_i *options,vw *all)

{
  int iVar1;
  csoaa *dat;
  polyprediction *ppVar2;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::csoaa,_example> *plVar3;
  long lVar4;
  undefined **ppuVar5;
  label_parser *plVar6;
  byte bVar7;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_210;
  _func_int **local_208;
  _func_int **local_200 [2];
  long local_1f0;
  option_group_definition local_1e8;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_int> local_d0;
  
  bVar7 = 0;
  dat = calloc_or_throw<CSOAA::csoaa>(1);
  *(undefined8 *)dat = 0;
  dat->pred = (polyprediction *)0x0;
  local_170._0_8_ = (_func_int **)0x1e;
  local_210 = local_200;
  local_210 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)local_170);
  local_200[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_210 + 0xe)," One Aga",8);
  builtin_strncpy((char *)((long)local_210 + 0x16),"inst All",8);
  *(undefined4 *)local_210 = 0x74736f43;
  builtin_strncpy((char *)((long)local_210 + 4)," Sen",4);
  *(undefined4 *)(local_210 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_210 + 0xc),"ve O",4);
  local_208 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_210 + local_170._0_8_) = '\0';
  local_1e8.m_name._M_dataplus._M_p = (pointer)&local_1e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_210,(char *)(local_170._0_8_ + (long)local_210));
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  local_190.field_2._M_allocated_capacity._0_4_ = 0x616f7363;
  local_190.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_190._M_string_length = 5;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_170,&local_190,&dat->num_classes);
  local_100 = true;
  local_1f0 = 0x29;
  local_1b0 = local_1a0;
  local_1b0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1b0,(ulong)&local_1f0);
  local_1a0[0] = local_1f0;
  builtin_strncpy((char *)((long)local_1b0 + 0x19),"s with <",8);
  builtin_strncpy((char *)((long)local_1b0 + 0x21),"k> costs",8);
  local_1b0[2] = 0x616c6369746c756d;
  local_1b0[3] = 0x2068746977207373;
  *local_1b0 = 0x696167612d656e4f;
  local_1b0[1] = 0x206c6c612d74736e;
  local_1a8 = local_1f0;
  *(char *)((long)local_1b0 + local_1f0) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_170);
  VW::config::option_group_definition::add<unsigned_int>(&local_1e8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1728;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  local_170._0_8_ = &PTR__typed_option_002d1728;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1e8);
  local_170._16_4_ = 0x616f7363;
  local_170._20_2_ = 0x61;
  local_170._8_8_ = (pointer)0x5;
  local_170._0_8_ = local_170 + 0x10;
  iVar1 = (*options->_vptr_options_i[1])(options,local_170);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar3 = (learner<CSOAA::csoaa,_example> *)0x0;
  }
  else {
    ppVar2 = calloc_or_throw<polyprediction>((ulong)dat->num_classes);
    dat->pred = ppVar2;
    l = setup_base(all->options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar3 = LEARNER::learner<CSOAA::csoaa,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,
                        (ulong)dat->num_classes,multiclass);
    ppuVar5 = &COST_SENSITIVE::cs_label;
    plVar6 = &all->p->lp;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      plVar6->default_label = (_func_void_void_ptr *)*ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
      plVar6 = (label_parser *)((long)plVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    all->label_type = cs;
    *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
    *(code **)(plVar3 + 0x68) = finish_example;
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = finish;
    all->cost_sensitive = (base_learner *)plVar3;
    dat = (csoaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_name._M_dataplus._M_p != &local_1e8.m_name.field_2) {
    operator_delete(local_1e8.m_name._M_dataplus._M_p);
  }
  if (dat != (csoaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* csoaa_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<csoaa>();
  option_group_definition new_options("Cost Sensitive One Against All");
  new_options.add(make_option("csoaa", c->num_classes).keep().help("One-against-all multiclass with <k> costs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("csoaa"))
    return nullptr;

  c->pred = calloc_or_throw<polyprediction>(c->num_classes);

  learner<csoaa, example>& l = init_learner(c, as_singleline(setup_base(*all.options, all)), predict_or_learn<true>,
      predict_or_learn<false>, c->num_classes, prediction_type::multiclass);
  all.p->lp = cs_label;
  all.label_type = label_type::cs;

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}